

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Table_UnstablePointers_Test::~Table_UnstablePointers_Test
          (Table_UnstablePointers_Test *this)

{
  Table_UnstablePointers_Test *this_local;
  
  ~Table_UnstablePointers_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Table, UnstablePointers) {
  IntTable table;

  const auto addr = [&](int i) {
    return reinterpret_cast<uintptr_t>(&*table.find(i));
  };

  table.insert(0);
  const uintptr_t old_ptr = addr(0);

  // This causes a rehash.
  table.insert(1);

  EXPECT_NE(old_ptr, addr(0));
}